

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O0

void __thiscall
hdc::SymbolTableBuilderVisitor::visit
          (SymbolTableBuilderVisitor *this,VariableDeclarationStatement *statement)

{
  SymbolTable *this_00;
  undefined8 this_01;
  Type *pTVar1;
  Expression *pEVar2;
  Variable *this_02;
  Token *token;
  LocalVariable *var;
  undefined1 local_50 [40];
  IdentifierExpression *id;
  Symbol *symbol;
  Type *type;
  VariableDeclarationStatement *statement_local;
  SymbolTableBuilderVisitor *this_local;
  
  symbol = (Symbol *)0x0;
  id = (IdentifierExpression *)0x0;
  type = (Type *)statement;
  statement_local = (VariableDeclarationStatement *)this;
  local_50._32_8_ = VariableDeclarationStatement::getName(statement);
  pTVar1 = VariableDeclarationStatement::getType((VariableDeclarationStatement *)type);
  if (pTVar1 != (Type *)0x0) {
    pTVar1 = VariableDeclarationStatement::getType((VariableDeclarationStatement *)type);
    (**(pTVar1->super_ASTNode)._vptr_ASTNode)(pTVar1,this);
    symbol = (Symbol *)VariableDeclarationStatement::getType((VariableDeclarationStatement *)type);
  }
  pEVar2 = VariableDeclarationStatement::getExpression((VariableDeclarationStatement *)type);
  if (pEVar2 != (Expression *)0x0) {
    pEVar2 = VariableDeclarationStatement::getExpression((VariableDeclarationStatement *)type);
    (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
    if (symbol == (Symbol *)0x0) {
      symbol = (Symbol *)this->lastType;
    }
  }
  this_00 = this->symbolTable;
  IdentifierExpression::getName_abi_cxx11_((IdentifierExpression *)local_50);
  id = (IdentifierExpression *)
       SymbolTable::hasLocalVariableOnCurrentScope(this_00,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  if (id != (IdentifierExpression *)0x0) {
    std::operator<<((ostream *)&std::cout,"Error: redefinition of variable on current scope\n");
    exit(0);
  }
  this_02 = (Variable *)operator_new(0x68);
  token = IdentifierExpression::getNameAsToken((IdentifierExpression *)local_50._32_8_);
  LocalVariable::LocalVariable((LocalVariable *)this_02,token);
  pTVar1 = (Type *)(**(code **)(*(long *)symbol + 0x18))();
  Variable::setType(this_02,pTVar1);
  id = (IdentifierExpression *)SymbolTable::add(this->symbolTable,(LocalVariable *)this_02);
  Def::addLocalVariable(this->currentDef,(LocalVariable *)this_02);
  this_01 = local_50._32_8_;
  pTVar1 = (Type *)(**(code **)(*(long *)symbol + 0x18))();
  Expression::setType((Expression *)this_01,pTVar1);
  IdentifierExpression::setSymbol((IdentifierExpression *)local_50._32_8_,(Symbol *)id);
  pTVar1 = Expression::getType((Expression *)local_50._32_8_);
  setLastType(this,pTVar1);
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(VariableDeclarationStatement *statement) {
    Type* type = nullptr;
    Symbol* symbol = nullptr;
    IdentifierExpression* id;

    id = statement->getName();

    if (statement->getType() != nullptr) {
        statement->getType()->accept(this);
        type = statement->getType();
    }

    if (statement->getExpression() != nullptr) {
        statement->getExpression()->accept(this);

        if (type == nullptr) {
            type = lastType;
        }
    }

    symbol = symbolTable->hasLocalVariableOnCurrentScope(id->getName());

    if (symbol == nullptr) {
        LocalVariable* var = new LocalVariable(id->getNameAsToken());
        var->setType(type->clone());
        symbol = symbolTable->add(var);
        currentDef->addLocalVariable(var);
        id->setType(type->clone());
        id->setSymbol(symbol);
        setLastType(id->getType());
    } else {
        std::cout << "Error: redefinition of variable on current scope\n";
        exit(0);
    }
}